

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

char * leveldb::DecodeEntry
                 (char *p,char *limit,uint32_t *shared,uint32_t *non_shared,uint32_t *value_length)

{
  char *pcVar1;
  uint32_t *value_length_local;
  uint32_t *non_shared_local;
  uint32_t *shared_local;
  char *limit_local;
  char *p_local;
  
  if ((long)limit - (long)p < 3) {
    return (char *)0x0;
  }
  *shared = (uint)(byte)*p;
  *non_shared = (uint)(byte)p[1];
  *value_length = (uint)(byte)p[2];
  if ((*shared | *non_shared | *value_length) < 0x80) {
    limit_local = p + 3;
  }
  else {
    pcVar1 = GetVarint32Ptr(p,limit,shared);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar1 = GetVarint32Ptr(pcVar1,limit,non_shared);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    limit_local = GetVarint32Ptr(pcVar1,limit,value_length);
    if (limit_local == (char *)0x0) {
      return (char *)0x0;
    }
  }
  if ((uint)((int)limit - (int)limit_local) < *non_shared + *value_length) {
    p_local = (char *)0x0;
  }
  else {
    p_local = limit_local;
  }
  return p_local;
}

Assistant:

static inline const char* DecodeEntry(const char* p, const char* limit,
                                      uint32_t* shared, uint32_t* non_shared,
                                      uint32_t* value_length) {
  if (limit - p < 3) return nullptr;
  *shared = reinterpret_cast<const unsigned char*>(p)[0];
  *non_shared = reinterpret_cast<const unsigned char*>(p)[1];
  *value_length = reinterpret_cast<const unsigned char*>(p)[2];
  if ((*shared | *non_shared | *value_length) < 128) {
    // Fast path: all three values are encoded in one byte each
    p += 3;
  } else {
    if ((p = GetVarint32Ptr(p, limit, shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, non_shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, value_length)) == nullptr) return nullptr;
  }

  if (static_cast<uint32_t>(limit - p) < (*non_shared + *value_length)) {
    return nullptr;
  }
  return p;
}